

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::setupTags(TranslateToFuzzReader *this)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Tag_*,_false> _Var2;
  Module *pMVar3;
  uint32_t uVar4;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  pointer puVar5;
  ulong uVar6;
  Name NVar7;
  IString IVar8;
  undefined1 auVar9 [16];
  HeapType local_48;
  HeapType local_40;
  IString *local_38;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> wasmTag;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> jsTag;
  
  puVar1 = (this->wasm->tags).
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->wasm->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    _Var2._M_head_impl =
         (puVar5->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
         super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) != (char *)0x0) &&
       (this->preserveImportsAndExports == false)) {
      *(undefined8 *)
       &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x28))->super_IString = 0;
      *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
      _Var2._M_head_impl =
           (puVar5->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      *(undefined8 *)
       &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x18))->super_IString = 0;
      *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
    }
  }
  uVar4 = Random::upTo(&this->random,3);
  if (uVar4 != 0) {
    uVar6 = (ulong)uVar4;
    do {
      addTag(this);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if ((this->preserveImportsAndExports == false) &&
     (uVar4 = Random::upTo(&this->random,2), uVar4 == 0)) {
    pMVar3 = this->wasm;
    NVar7.super_IString.str = (IString)wasm::IString::interned(7,"wasmtag",0);
    IVar8.str = (string_view)Names::getValidTagName(pMVar3,NVar7);
    wasm::HeapType::HeapType(&local_48,(Signature)ZEXT816(2));
    local_38 = (IString *)operator_new(0x40);
    local_38[3].str._M_len = 0;
    *(char **)((long)(local_38 + 3) + 8) = (char *)0x0;
    (local_38->str)._M_len = 0;
    *(char **)((long)&local_38->str + 8) = (char *)0x0;
    local_38[1].str._M_len = 0;
    *(char **)((long)(local_38 + 1) + 8) = (char *)0x0;
    local_38[2].str._M_len = 0;
    *(char **)((long)(local_38 + 2) + 8) = (char *)0x0;
    *(char **)((long)(local_38 + 3) + 8) = (char *)0x10;
    local_38->str = IVar8.str;
    *(uintptr_t *)((long)(local_38 + 3) + 8) = local_48.id;
    auVar9 = wasm::IString::interned(0xf,"fuzzing-support",0);
    *(undefined1 (*) [16])((long)(local_38 + 1) + 8) = auVar9;
    auVar9 = wasm::IString::interned(7,"wasmtag",0);
    *(undefined1 (*) [16])((long)(local_38 + 2) + 8) = auVar9;
    wasm::Module::addTag((unique_ptr *)this->wasm);
    pMVar3 = this->wasm;
    NVar7.super_IString.str = (IString)wasm::IString::interned(5,"jstag",0);
    IVar8.str = (string_view)Names::getValidTagName(pMVar3,NVar7);
    wasm::HeapType::HeapType(&local_40,(Signature)ZEXT816(10));
    wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)operator_new(0x40);
    (((IString *)
     ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x30))->str)._M_len = 0;
    *(char **)((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x38) = (char *)0x0;
    (((IString *)
     ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x20))->str)._M_len = 0;
    *(char **)((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x28) = (char *)0x0;
    (((IString *)
     ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x10))->str)._M_len = 0;
    *(char **)((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18) = (char *)0x0;
    *(undefined8 *)
     wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = 0;
    *(char **)((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 8) = (char *)0x0;
    *(char **)((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x38) = (char *)0x10;
    *(string_view *)
     wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = IVar8.str;
    *(uintptr_t *)
     ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x38) = local_40.id;
    auVar9 = wasm::IString::interned(0xf,"fuzzing-support",0);
    *(undefined1 (*) [16])
     ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18) = auVar9;
    auVar9 = wasm::IString::interned(5,"jstag",0);
    *(undefined1 (*) [16])
     ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x28) = auVar9;
    wasm::Module::addTag((unique_ptr *)this->wasm);
    if ((__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)
        wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x0) {
      operator_delete((void *)wasmTag._M_t.
                              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
                              .super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl,0x40);
    }
    if (local_38 != (IString *)0x0) {
      operator_delete(local_38,0x40);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTags() {
  // As in modifyInitialFunctions(), we can't allow arbitrary tag imports, which
  // would trap when the fuzzing infrastructure doesn't know what to provide.
  for (auto& tag : wasm.tags) {
    if (tag->imported() && !preserveImportsAndExports) {
      tag->module = tag->base = Name();
    }
  }

  // Add some random tags.
  Index num = upTo(3);
  for (size_t i = 0; i < num; i++) {
    addTag();
  }

  // Add the fuzzing support tags manually sometimes.
  if (!preserveImportsAndExports && oneIn(2)) {
    auto wasmTag = builder.makeTag(Names::getValidTagName(wasm, "wasmtag"),
                                   Signature(Type::i32, Type::none));
    wasmTag->module = "fuzzing-support";
    wasmTag->base = "wasmtag";
    wasm.addTag(std::move(wasmTag));

    auto externref = Type(HeapType::ext, Nullable);
    auto jsTag = builder.makeTag(Names::getValidTagName(wasm, "jstag"),
                                 Signature(externref, Type::none));
    jsTag->module = "fuzzing-support";
    jsTag->base = "jstag";
    wasm.addTag(std::move(jsTag));
  }
}